

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mean.hpp
# Opt level: O0

void mean::run(vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_> *v_input,
              vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_> *v_output)

{
  value_type pgVar1;
  value_type pgVar2;
  size_type sVar3;
  const_reference ppgVar4;
  long lVar5;
  vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_> *in_RSI;
  vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_> *in_RDI;
  float fVar6;
  double dVar7;
  float f_2;
  int i_1;
  float f_1;
  int i;
  float norm;
  int ir;
  float f;
  int ic;
  ggml_tensor *t_layer;
  ggml_tensor *ctrl_out;
  size_t il;
  int local_44;
  int local_3c;
  float local_38;
  int local_34;
  float local_30;
  int local_2c;
  ulong local_18;
  
  printf("%s: Running mean...\n","run");
  local_18 = 0;
  while( true ) {
    sVar3 = std::vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>::size(in_RDI);
    if (sVar3 <= local_18) break;
    ppgVar4 = std::vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>::operator[]
                        (in_RSI,local_18);
    pgVar1 = *ppgVar4;
    ggml_format_name(pgVar1,"direction.%zu",local_18 + 1);
    ppgVar4 = std::vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>::operator[]
                        (in_RDI,local_18);
    pgVar2 = *ppgVar4;
    if (pgVar2->ne[0] != pgVar1->ne[0]) {
      ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/examples/cvector-generator/mean.hpp"
                 ,0x16,"GGML_ASSERT(%s) failed","t_layer->ne[0] == ctrl_out->ne[0]");
    }
    for (local_2c = 0; (long)local_2c < pgVar2->ne[0]; local_2c = local_2c + 1) {
      local_30 = 0.0;
      for (local_34 = 0; (long)local_34 < pgVar2->ne[1]; local_34 = local_34 + 1) {
        fVar6 = (float)ggml_get_f32_nd(pgVar2,local_2c,local_34,0);
        local_30 = fVar6 + local_30;
      }
      ggml_set_f32_1d(local_30 / (float)pgVar2->ne[1],pgVar1,local_2c);
    }
    local_38 = 0.0;
    local_3c = 0;
    while( true ) {
      lVar5 = ggml_nelements(pgVar1);
      if (lVar5 <= local_3c) break;
      fVar6 = (float)ggml_get_f32_1d(pgVar1,local_3c);
      local_38 = fVar6 * fVar6 + local_38;
      local_3c = local_3c + 1;
    }
    dVar7 = std::sqrt((double)(ulong)(uint)local_38);
    local_44 = 0;
    while( true ) {
      lVar5 = ggml_nelements(pgVar1);
      if (lVar5 <= local_44) break;
      fVar6 = (float)ggml_get_f32_1d(pgVar1,local_44);
      ggml_set_f32_1d(fVar6 / SUB84(dVar7,0),pgVar1,local_44);
      local_44 = local_44 + 1;
    }
    sVar3 = std::vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>::size(in_RDI);
    printf("%s: Done layer %d / %d\n","run",(ulong)((int)local_18 + 1),sVar3 & 0xffffffff);
    local_18 = local_18 + 1;
  }
  return;
}

Assistant:

static void run(
        const std::vector<struct ggml_tensor *> & v_input, // shape of v_input[0]: [n_embd, n_samples]
        const std::vector<struct ggml_tensor *> & v_output) {
    printf("%s: Running mean...\n", __func__);
    for (size_t il = 0; il < v_input.size(); ++il) {
        // prepare output vector
        struct ggml_tensor * ctrl_out = v_output[il];
        ggml_format_name(ctrl_out, "direction.%zu", il+1);

        // calculate mean vector
        struct ggml_tensor * t_layer = v_input[il];
        GGML_ASSERT(t_layer->ne[0] == ctrl_out->ne[0]); // == n_embd
        for (int ic = 0; ic < t_layer->ne[0]; ic++) {
            float f = 0.0;
            for (int ir = 0; ir < t_layer->ne[1]; ir++) {
                f += ggml_get_f32_nd(t_layer, ic, ir, 0, 0);
            }
            f /= t_layer->ne[1];
            ggml_set_f32_1d(ctrl_out, ic, f);
        }

        // normalize output vector
        float norm = 0.0;
        for (int i = 0; i < ggml_nelements(ctrl_out); i++) {
            float f = ggml_get_f32_1d(ctrl_out, i);
            norm += f*f;
        }
        norm = sqrt(norm);
        for (int i = 0; i < ggml_nelements(ctrl_out); i++) {
            float f = ggml_get_f32_1d(ctrl_out, i);
            ggml_set_f32_1d(ctrl_out, i, f / norm);
        }

        printf("%s: Done layer %d / %d\n", __func__, (int) il+1, (int) v_input.size());
    }
}